

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AsyncOut.cpp
# Opt level: O0

void amrex::AsyncOut::Finalize(void)

{
  bool bVar1;
  pointer in_RAX;
  unique_ptr<amrex::BackgroundThread,_std::default_delete<amrex::BackgroundThread>_> *unaff_retaddr;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<amrex::BackgroundThread,_std::default_delete<amrex::BackgroundThread>_>
                      *)0x122f09d);
  if (bVar1) {
    std::unique_ptr<amrex::BackgroundThread,_std::default_delete<amrex::BackgroundThread>_>::reset
              (unaff_retaddr,in_RAX);
  }
  return;
}

Assistant:

void Finalize ()
{
    if (s_thread) {
        s_thread.reset();
    }

#ifdef AMREX_USE_MPI
    if (s_comm != MPI_COMM_NULL) MPI_Comm_free(&s_comm);
    s_comm = MPI_COMM_NULL;
#endif
}